

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cc
# Opt level: O3

void __thiscall re2c::ScannerState::ScannerState(ScannerState *this,ScannerState *s)

{
  char *pcVar1;
  uint32_t uVar2;
  
  pcVar1 = s->ptr;
  this->tok = s->tok;
  this->ptr = pcVar1;
  pcVar1 = s->pos;
  this->cur = s->cur;
  this->pos = pcVar1;
  pcVar1 = s->bot;
  this->ctx = s->ctx;
  this->bot = pcVar1;
  pcVar1 = s->top;
  this->lim = s->lim;
  this->top = pcVar1;
  this->eof = s->eof;
  this->tchar = s->tchar;
  uVar2 = s->cline;
  this->tline = s->tline;
  this->cline = uVar2;
  this->in_parse = s->in_parse;
  this->lexer_state = s->lexer_state;
  return;
}

Assistant:

ScannerState::ScannerState (const ScannerState & s)
	: tok (s.tok)
	, ptr (s.ptr)
	, cur (s.cur)
	, pos (s.pos)
	, ctx (s.ctx)
	, bot (s.bot)
	, lim (s.lim)
	, top (s.top)
	, eof (s.eof)
	, tchar (s.tchar)
	, tline (s.tline)
	, cline (s.cline)
	, in_parse (s.in_parse)
	, lexer_state (s.lexer_state)
{}